

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

void set_low_temp_var_flag_64x64
               (CommonModeInfoParams *mi_params,PartitionSearchInfo *part_info,MACROBLOCKD *xd,
               VP64x64 *vt,int64_t *thresholds,int mi_col,int mi_row)

{
  MB_MODE_INFO **ppMVar1;
  int lvl2_idx;
  int64_t threshold_32x32;
  MB_MODE_INFO **this_mi;
  int idx_str;
  int lvl1_idx;
  int part_idx_1;
  int part_idx;
  int mi_col_local;
  int64_t *thresholds_local;
  VP64x64 *vt_local;
  MACROBLOCKD *xd_local;
  PartitionSearchInfo *part_info_local;
  CommonModeInfoParams *mi_params_local;
  
  if ((*xd->mi)->bsize == BLOCK_64X64) {
    if ((long)(vt->part_variances).none.variance < *thresholds >> 1) {
      part_info->variance_low[0] = '\x01';
    }
  }
  else if ((*xd->mi)->bsize == BLOCK_64X32) {
    for (part_idx = 0; part_idx < 2; part_idx = part_idx + 1) {
      if ((long)(vt->part_variances).horz[part_idx].variance < *thresholds >> 2) {
        part_info->variance_low[part_idx + 1] = '\x01';
      }
    }
  }
  else if ((*xd->mi)->bsize == BLOCK_32X64) {
    for (part_idx_1 = 0; part_idx_1 < 2; part_idx_1 = part_idx_1 + 1) {
      if ((long)(vt->part_variances).vert[part_idx_1].variance < *thresholds >> 2) {
        part_info->variance_low[part_idx_1 + 3] = '\x01';
      }
    }
  }
  else {
    for (lvl1_idx = 0; lvl1_idx < 4; lvl1_idx = lvl1_idx + 1) {
      ppMVar1 = mi_params->mi_grid_base +
                (mi_params->mi_stride * (mi_row + set_low_temp_var_flag_64x64::idx[lvl1_idx][0]) +
                 mi_col + set_low_temp_var_flag_64x64::idx[lvl1_idx][1]);
      if (((mi_col + set_low_temp_var_flag_64x64::idx[lvl1_idx][1] < mi_params->mi_cols) &&
          (mi_row + set_low_temp_var_flag_64x64::idx[lvl1_idx][0] < mi_params->mi_rows)) &&
         (*ppMVar1 != (MB_MODE_INFO *)0x0)) {
        if ((*ppMVar1)->bsize == BLOCK_32X32) {
          if ((long)vt->split[lvl1_idx].part_variances.none.variance < thresholds[1] * 5 >> 3) {
            part_info->variance_low[lvl1_idx + 5] = '\x01';
          }
        }
        else if ((((*ppMVar1)->bsize == BLOCK_16X16) || ((*ppMVar1)->bsize == BLOCK_32X16)) ||
                ((*ppMVar1)->bsize == BLOCK_16X32)) {
          for (lvl2_idx = 0; lvl2_idx < 4; lvl2_idx = lvl2_idx + 1) {
            if ((long)vt->split[lvl1_idx].split[lvl2_idx].part_variances.none.variance <
                thresholds[2] >> 8) {
              part_info->variance_low[lvl1_idx * 4 + lvl2_idx + 9] = '\x01';
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static inline void set_low_temp_var_flag_64x64(CommonModeInfoParams *mi_params,
                                               PartitionSearchInfo *part_info,
                                               MACROBLOCKD *xd, VP64x64 *vt,
                                               const int64_t thresholds[],
                                               int mi_col, int mi_row) {
  if (xd->mi[0]->bsize == BLOCK_64X64) {
    if ((vt->part_variances).none.variance < (thresholds[0] >> 1))
      part_info->variance_low[0] = 1;
  } else if (xd->mi[0]->bsize == BLOCK_64X32) {
    for (int part_idx = 0; part_idx < 2; part_idx++) {
      if (vt->part_variances.horz[part_idx].variance < (thresholds[0] >> 2))
        part_info->variance_low[part_idx + 1] = 1;
    }
  } else if (xd->mi[0]->bsize == BLOCK_32X64) {
    for (int part_idx = 0; part_idx < 2; part_idx++) {
      if (vt->part_variances.vert[part_idx].variance < (thresholds[0] >> 2))
        part_info->variance_low[part_idx + 3] = 1;
    }
  } else {
    static const int idx[4][2] = { { 0, 0 }, { 0, 8 }, { 8, 0 }, { 8, 8 } };
    for (int lvl1_idx = 0; lvl1_idx < 4; lvl1_idx++) {
      const int idx_str = mi_params->mi_stride * (mi_row + idx[lvl1_idx][0]) +
                          mi_col + idx[lvl1_idx][1];
      MB_MODE_INFO **this_mi = mi_params->mi_grid_base + idx_str;

      if (mi_params->mi_cols <= mi_col + idx[lvl1_idx][1] ||
          mi_params->mi_rows <= mi_row + idx[lvl1_idx][0])
        continue;

      if (*this_mi == NULL) continue;

      if ((*this_mi)->bsize == BLOCK_32X32) {
        int64_t threshold_32x32 = (5 * thresholds[1]) >> 3;
        if (vt->split[lvl1_idx].part_variances.none.variance < threshold_32x32)
          part_info->variance_low[lvl1_idx + 5] = 1;
      } else {
        // For 32x16 and 16x32 blocks, the flag is set on each 16x16 block
        // inside.
        if ((*this_mi)->bsize == BLOCK_16X16 ||
            (*this_mi)->bsize == BLOCK_32X16 ||
            (*this_mi)->bsize == BLOCK_16X32) {
          for (int lvl2_idx = 0; lvl2_idx < 4; lvl2_idx++) {
            if (vt->split[lvl1_idx]
                    .split[lvl2_idx]
                    .part_variances.none.variance < (thresholds[2] >> 8))
              part_info->variance_low[(lvl1_idx << 2) + lvl2_idx + 9] = 1;
          }
        }
      }
    }
  }
}